

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O2

apx_clientTestConnection_t * apx_clientTestConnection_new(void)

{
  apx_error_t aVar1;
  apx_clientTestConnection_t *self;
  
  self = (apx_clientTestConnection_t *)malloc(0x5d0);
  if (self != (apx_clientTestConnection_t *)0x0) {
    aVar1 = apx_clientTestConnection_create(self);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_clientTestConnection_t *)0x0;
}

Assistant:

apx_clientTestConnection_t *apx_clientTestConnection_new(void)
{
   apx_clientTestConnection_t *self = (apx_clientTestConnection_t*) malloc(sizeof(apx_clientTestConnection_t));
   if (self != NULL)
   {
      apx_error_t result = apx_clientTestConnection_create(self);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = 0;
      }
   }
   return self;
}